

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O2

void SHEvaluate(vec3f *w,int lmax,float *out)

{
  int iVar1;
  float *pfVar2;
  int i;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  char *__assertion;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  float *sout;
  float *pfVar19;
  int iVar20;
  float *cout;
  long lVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float afStack_90 [2];
  float afStack_88 [2];
  long local_80;
  vec3f *local_78;
  uint local_6c;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  float *local_48;
  undefined8 local_40;
  float *local_38;
  
  local_38 = out;
  if (0x1c < lmax) {
    afStack_90[0] = 2.136885e-39;
    afStack_90[1] = 0.0;
    __assert_fail("lmax <= 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x84,"void SHEvaluate(const vec3f &, int, float *)");
  }
  fVar23 = w->z;
  fVar24 = SQRT(w->x * w->x + w->y * w->y + fVar23 * fVar23);
  if ((fVar24 <= 0.995) || (1.005 <= fVar24)) {
    afStack_90[0] = 2.136928e-39;
    afStack_90[1] = 0.0;
    __assert_fail("norm(w) > .995f && norm(w) < 1.005f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x8c,"void SHEvaluate(const vec3f &, int, float *)");
  }
  *out = 1.0;
  out[2] = fVar23;
  iVar3 = 3;
  iVar8 = 0;
  do {
    iVar12 = iVar8 + 2;
    if (lmax < iVar12) {
      fVar25 = 1.0;
      fVar24 = 1.0 - fVar23 * fVar23;
      if (fVar24 <= 0.0) {
        fVar24 = 0.0;
      }
      iVar3 = 1;
      fVar26 = -1.0;
      iVar8 = 3;
      fVar27 = SQRT(fVar24);
      goto LAB_00173f21;
    }
    iVar15 = iVar8 + 1;
    fVar24 = ((float)iVar3 * fVar23 * out[iVar15 * iVar12] -
             (float)(iVar8 + 1) * out[iVar15 * iVar8]) / (float)iVar12;
    out[(iVar8 + 3) * iVar12] = fVar24;
    if (NAN(fVar24)) {
      __assertion = "!isnan(P(l, 0))";
      uVar17 = 0x4e;
      goto LAB_001743b3;
    }
    iVar3 = iVar3 + 2;
    iVar8 = iVar15;
  } while (ABS(fVar24) != INFINITY);
  __assertion = "!isinf(P(l, 0))";
  uVar17 = 0x4f;
  goto LAB_001743b3;
LAB_00173f21:
  if (lmax < iVar3) goto LAB_00173f74;
  fVar28 = fVar26 * fVar25 * fVar27;
  out[(iVar3 + 2) * iVar3] = fVar28;
  if (NAN(fVar28)) {
    __assertion = "!isnan(P(l, l))";
    uVar17 = 0x59;
    goto LAB_001743b3;
  }
  if (ABS(fVar28) == INFINITY) {
    __assertion = "!isinf(P(l, l))";
    uVar17 = 0x5a;
    goto LAB_001743b3;
  }
  fVar26 = -fVar26;
  fVar25 = fVar25 * (float)iVar8;
  fVar27 = fVar27 * SQRT(fVar24);
  iVar8 = iVar8 + 2;
  iVar3 = iVar3 + 1;
  goto LAB_00173f21;
LAB_00173f74:
  iVar3 = 3;
  iVar8 = 3;
  do {
    if (lmax < iVar3 + -1) {
      local_78 = w;
      local_40 = (long)lmax;
      local_48 = out + 1;
      lVar9 = 3;
      iVar3 = 4;
      iVar8 = 2;
      afStack_90[0] = 8.40779e-45;
      afStack_90[1] = 0.0;
      iVar12 = 6;
      iVar15 = 6;
      iVar16 = 2;
      local_50 = (ulong)(uint)lmax;
      lVar21 = 0;
      uVar14 = (ulong)(uint)lmax;
      do {
        if (lmax < lVar9) {
          local_6c = (int)uVar14 + 1;
          lVar4 = -((ulong)(local_6c * local_6c) * 4 + 0xf & 0x3fffffff0);
          lVar5 = (long)afStack_88 + lVar4;
          *(undefined8 *)((long)afStack_88 + lVar4 + -8) = 8;
          lVar9 = *(long *)((long)afStack_88 + lVar4 + -8);
          *(undefined8 *)((long)afStack_88 + lVar4 + -8) = 1;
          lVar21 = *(long *)((long)afStack_88 + lVar4 + -8);
          lVar11 = 0;
          local_48 = (float *)lVar5;
          iVar3 = 0;
          lVar6 = lVar5;
          lVar18 = 0;
          while (uVar14 = local_50, uVar17 = local_6c, lVar18 <= local_40) {
            local_68 = lVar9;
            local_60 = lVar11;
            local_58 = lVar6;
            local_80 = lVar18 + 1;
            for (lVar9 = 0; lVar21 != lVar9; lVar9 = lVar9 + 1) {
              *(undefined8 *)((long)afStack_88 + lVar4 + -8) = 0x174148;
              fVar23 = K((int)lVar18,iVar3 + (int)lVar9);
              *(float *)(((lVar11 << 0x1e) >> 0x1e) + lVar6 + lVar9 * 4) = fVar23;
            }
            iVar3 = iVar3 + -1;
            lVar6 = local_58 + -4;
            lVar11 = local_60 + local_68;
            lVar9 = local_68 + 8;
            lVar21 = lVar21 + 2;
            lVar18 = local_80;
          }
          uVar7 = (ulong)local_6c * 4 + 0xf & 0xfffffffffffffff0;
          sout = (float *)(lVar5 - uVar7);
          cout = (float *)((long)sout - uVar7);
          fVar23 = 1.0 - local_78->z * local_78->z;
          if (fVar23 <= 0.0) {
            fVar23 = 0.0;
          }
          fVar23 = SQRT(fVar23);
          if ((fVar23 != 0.0) || (NAN(fVar23))) {
            fVar24 = local_78->x;
            fVar25 = local_78->y;
            cout[-2] = 2.135926e-39;
            cout[-1] = 0.0;
            sinCosIndexed(fVar25 / fVar23,fVar24 / fVar23,uVar17,sout,cout);
            uVar14 = local_50;
          }
          else {
            for (lVar9 = 0; lVar9 <= local_40; lVar9 = lVar9 + 1) {
              sout[lVar9] = 0.0;
            }
            for (lVar9 = 0; lVar9 <= local_40; lVar9 = lVar9 + 1) {
              cout[lVar9] = 1.0;
            }
          }
          if (SHEvaluate(vec3f_const&,int,float*)::sqrt2 == '\0') {
            cout[-2] = 2.136945e-39;
            cout[-1] = 0.0;
            iVar3 = __cxa_guard_acquire();
            if (iVar3 != 0) {
              SHEvaluate::sqrt2 = 1.4142135;
              cout[-2] = 2.136987e-39;
              cout[-1] = 0.0;
              __cxa_guard_release();
            }
          }
          fVar23 = SHEvaluate::sqrt2;
          cout[-2] = 1.4013e-45;
          cout[-1] = 0.0;
          uVar7 = *(ulong *)(cout + -2);
          cout[-2] = 4.2039e-45;
          cout[-1] = 0.0;
          uVar10 = *(ulong *)(cout + -2);
          cout[-2] = 2.8026e-45;
          cout[-1] = 0.0;
          uVar13 = *(ulong *)(cout + -2);
          iVar8 = 0;
          local_40._0_4_ = 0;
          uVar17 = 0;
          iVar3 = 0;
          do {
            pfVar2 = local_38;
            uVar22 = 0;
            if (0 < (int)uVar17) {
              uVar22 = (ulong)uVar17;
            }
            if ((int)uVar14 < iVar3) {
              return;
            }
            local_60 = CONCAT44(local_60._4_4_,(int)uVar13);
            local_68 = CONCAT44(local_68._4_4_,(int)uVar10);
            local_58 = CONCAT44(local_58._4_4_,iVar8);
            lVar4 = (long)iVar8;
            lVar9 = (long)local_48 + lVar4 * 4;
            uVar14 = (ulong)(int)uVar17;
            pfVar19 = sout + -uVar14;
            lVar21 = (long)(iVar3 * (iVar3 + 1));
            iVar8 = (int)local_40;
            while (uVar22 != uVar14) {
              fVar24 = *(float *)(lVar9 + uVar14 * 4) * fVar23 * local_38[iVar8] * *pfVar19;
              local_38[lVar4 + uVar14] = fVar24;
              if (NAN(fVar24)) {
                cout[-2] = 2.136554e-39;
                cout[-1] = 0.0;
                __assert_fail("!isnan(out[SHIndex(l,m)])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                              ,0xa6,"void SHEvaluate(const vec3f &, int, float *)");
              }
              uVar14 = uVar14 + 1;
              iVar8 = iVar8 + -1;
              pfVar19 = pfVar19 + -1;
              if (ABS(fVar24) == INFINITY) {
                cout[-2] = 2.136598e-39;
                cout[-1] = 0.0;
                __assert_fail("!isinf(out[SHIndex(l,m)])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                              ,0xa7,"void SHEvaluate(const vec3f &, int, float *)");
              }
            }
            local_38[lVar21] = *(float *)((long)local_48 + lVar21 * 4) * local_38[lVar21];
            cout[-2] = 1.4013e-45;
            cout[-1] = 0.0;
            uVar14 = *(ulong *)(cout + -2);
            while ((uVar7 & 0xffffffff) != uVar14) {
              fVar24 = *(float *)(lVar9 + uVar14 * 4) * fVar23 * cout[uVar14] *
                       pfVar2[lVar4 + uVar14];
              pfVar2[lVar4 + uVar14] = fVar24;
              if (NAN(fVar24)) {
                cout[-2] = 2.136641e-39;
                cout[-1] = 0.0;
                __assert_fail("!isnan(out[SHIndex(l,m)])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                              ,0xad,"void SHEvaluate(const vec3f &, int, float *)");
              }
              uVar14 = uVar14 + 1;
              if (ABS(fVar24) == INFINITY) {
                cout[-2] = 2.136684e-39;
                cout[-1] = 0.0;
                __assert_fail("!isinf(out[SHIndex(l,m)])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                              ,0xae,"void SHEvaluate(const vec3f &, int, float *)");
              }
            }
            uVar17 = uVar17 - 1;
            uVar7 = (ulong)((int)uVar7 + 1);
            local_40._0_4_ = (int)local_40 + (int)local_68;
            uVar10 = (ulong)((int)local_68 + 2);
            iVar8 = (int)local_58 + (int)local_60;
            uVar13 = (ulong)((int)local_60 + 2);
            uVar14 = local_50;
            iVar3 = iVar3 + 1;
          } while( true );
        }
        iVar1 = (int)lVar9;
        lVar9 = lVar9 + 1;
        lVar4 = 0;
        iVar20 = iVar16;
        while (lVar21 + 1 != lVar4) {
          fVar24 = (local_48[iVar12 + lVar4] * (float)(iVar1 * 2 + -1) * fVar23 -
                   (float)((int)lVar21 + (int)lVar4 + 3) * local_48[iVar8 + lVar4]) / (float)iVar20;
          local_48[(int)lVar9 * iVar1 + lVar4] = fVar24;
          if (NAN(fVar24)) {
            __assertion = "!isnan(P(l, m))";
            uVar17 = 0x6e;
            goto LAB_001743b3;
          }
          lVar4 = lVar4 + 1;
          iVar20 = iVar20 + -1;
          if (ABS(fVar24) == INFINITY) {
            __assertion = "!isinf(P(l, m))";
            uVar17 = 0x6f;
            goto LAB_001743b3;
          }
        }
        iVar16 = iVar16 + 1;
        iVar8 = iVar8 + iVar3;
        iVar3 = iVar3 + 2;
        iVar12 = iVar12 + iVar15;
        iVar15 = iVar15 + 2;
        lVar21 = lVar21 + 1;
        uVar14 = local_50;
      } while( true );
    }
    fVar24 = (float)iVar8 * fVar23 * out[(iVar3 + -2) * iVar3];
    out[(iVar3 + -1) * iVar3 + iVar3 + -2] = fVar24;
    if (NAN(fVar24)) {
      __assertion = "!isnan(P(l, l-1))";
      uVar17 = 100;
      goto LAB_001743b3;
    }
    iVar8 = iVar8 + 2;
    iVar3 = iVar3 + 1;
  } while (ABS(fVar24) != INFINITY);
  __assertion = "!isinf(P(l, l-1))";
  uVar17 = 0x65;
LAB_001743b3:
  afStack_90[0] = 2.136511e-39;
  afStack_90[1] = 0.0;
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                ,uVar17,"void legendrep(float, int, float *)");
}

Assistant:

void SHEvaluate(const vec3f &w, int lmax, float *out) {
    assert(lmax <= 28);
    // if (lmax > 28) {
    //     console.error("SHEvaluate() runs out of numerical precision for lmax > 28. "
    //            "If you need more bands, try recompiling using doubles.");
    //     exit(1);
    // }

    // Compute Legendre polynomial values for $\cos\theta$
    assert(norm(w) > .995f && norm(w) < 1.005f);
    legendrep(w.z, lmax, out);

    // Compute $K_l^m$ coefficients
    float Klm[SHTerms(lmax)];
    for (int l = 0; l <= lmax; ++l)
        for (int m = -l; m <= l; ++m)
            Klm[SHIndex(l, m)] = K(l, m);

    // Compute $\sin\phi$ and $\cos\phi$ values
    float sins[lmax+1], coss[lmax+1];
    float xyLen = sqrtf(fmax(0.f, 1.f - w.z*w.z));
    if (xyLen == 0.f) {
        for (int i = 0; i <= lmax; ++i) sins[i] = 0.f;
        for (int i = 0; i <= lmax; ++i) coss[i] = 1.f;
    }
    else
        sinCosIndexed(w.y / xyLen, w.x / xyLen, lmax+1, sins, coss);

    // Apply SH definitions to compute final $(l,m)$ values
    static const float sqrt2 = sqrtf(2.f);
    for (int l = 0; l <= lmax; ++l) {
        for (int m = -l; m < 0; ++m)
        {
            out[SHIndex(l, m)] = sqrt2 * Klm[SHIndex(l, m)] *
                out[SHIndex(l, -m)] * sins[-m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
        out[SHIndex(l, 0)] *= Klm[SHIndex(l, 0)];
        for (int m = 1; m <= l; ++m)
        {
            out[SHIndex(l, m)] *= sqrt2 * Klm[SHIndex(l, m)] * coss[m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
    }
}